

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O1

void __thiscall adios2::core::VariableBase::CheckDimensionsCommon(VariableBase *this,string *hint)

{
  pointer puVar1;
  pointer puVar2;
  difference_type __n;
  long lVar3;
  ulong uVar4;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->m_ShapeID != LocalValue) {
    puVar2 = (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 == puVar1) {
LAB_003e92aa:
      puVar2 = (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar2 != puVar1) {
        lVar3 = 0;
        do {
          lVar3 = lVar3 + (ulong)(*puVar2 == 0xfffffffffffffffd);
          puVar2 = puVar2 + 1;
        } while (puVar2 != puVar1);
        if (lVar3 != 0) goto LAB_003e930c;
      }
      puVar2 = (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar2 != puVar1) {
        lVar3 = 0;
        do {
          lVar3 = lVar3 + (ulong)(*puVar2 == 0xfffffffffffffffd);
          puVar2 = puVar2 + 1;
        } while (puVar2 != puVar1);
        if (lVar3 != 0) goto LAB_003e930c;
      }
    }
    else {
      lVar3 = 0;
      do {
        lVar3 = lVar3 + (ulong)(*puVar2 == 0xfffffffffffffffd);
        puVar2 = puVar2 + 1;
      } while (puVar2 != puVar1);
      if (lVar3 == 0) goto LAB_003e92aa;
LAB_003e930c:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Core","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"VariableBase","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"CheckDimensionsCommon","");
      std::operator+(&local_48,
                     "LocalValueDim parameter is only allowed as {LocalValueDim} in Shape dimensions "
                     ,hint);
      helper::Throw<std::invalid_argument>(&local_68,&local_88,&local_a8,&local_48,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  puVar2 = (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar1 = (this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (*puVar2 == 0xfffffffffffffffe);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    if (1 < uVar4) goto LAB_003e946b;
  }
  puVar2 = (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar1 = (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(*puVar2 == 0xfffffffffffffffe);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    if (lVar3 != 0) goto LAB_003e946b;
  }
  puVar2 = (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar1 = (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar2 == puVar1) {
    return;
  }
  lVar3 = 0;
  do {
    lVar3 = lVar3 + (ulong)(*puVar2 == 0xfffffffffffffffe);
    puVar2 = puVar2 + 1;
  } while (puVar2 != puVar1);
  if (lVar3 == 0) {
    return;
  }
LAB_003e946b:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Core","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"VariableBase","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CheckDimensionsCommon","");
  std::operator+(&local_48,
                 "JoinedDim is only allowed once in Shape and cannot appear in start/count, ",hint);
  helper::Throw<std::invalid_argument>(&local_68,&local_88,&local_a8,&local_48,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void VariableBase::CheckDimensionsCommon(const std::string hint) const
{
    if (m_ShapeID != ShapeID::LocalValue)
    {
        if ((!m_Shape.empty() && std::count(m_Shape.begin(), m_Shape.end(), LocalValueDim) > 0) ||
            (!m_Start.empty() && std::count(m_Start.begin(), m_Start.end(), LocalValueDim) > 0) ||
            (!m_Count.empty() && std::count(m_Count.begin(), m_Count.end(), LocalValueDim) > 0))
        {
            helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckDimensionsCommon",
                                                 "LocalValueDim parameter is only "
                                                 "allowed as {LocalValueDim} in Shape dimensions " +
                                                     hint);
        }
    }

    if ((!m_Shape.empty() && std::count(m_Shape.begin(), m_Shape.end(), JoinedDim) > 1) ||
        (!m_Start.empty() && std::count(m_Start.begin(), m_Start.end(), JoinedDim) > 0) ||
        (!m_Count.empty() && std::count(m_Count.begin(), m_Count.end(), JoinedDim) > 0))
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckDimensionsCommon",
                                             "JoinedDim is only allowed once in "
                                             "Shape and cannot appear in start/count, " +
                                                 hint);
    }
}